

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_local_value.hpp
# Opt level: O2

void __thiscall
ylt::metric::thread_local_value<long>::~thread_local_value(thread_local_value<long> *this)

{
  pointer paVar1;
  vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
  *__range3;
  atomic<std::atomic<long>_*> *t;
  pointer paVar2;
  
  paVar1 = (this->duplicates_).
           super__Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (paVar2 = (this->duplicates_).
                super__Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start; paVar2 != paVar1; paVar2 = paVar2 + 1) {
    if ((paVar2->_M_b)._M_p != (__pointer_type)0x0) {
      operator_delete((paVar2->_M_b)._M_p,8);
    }
  }
  std::
  _Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
  ::~_Vector_base((_Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
                   *)this);
  return;
}

Assistant:

~thread_local_value() {
    for (auto &t : duplicates_) {
      if (t) {
        delete t.load();
      }
    }
  }